

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O3

BasicHandleInfo * __thiscall
helics::HandleManager::addHandle
          (HandleManager *this,GlobalFederateId fed_id,InterfaceType what,string_view key,
          string_view type,string_view units)

{
  _Map_pointer ppBVar1;
  _Elt_pointer pBVar2;
  InterfaceType local_41;
  InterfaceHandle local_40;
  GlobalFederateId local_3c;
  string local_38;
  
  ppBVar1 = (this->handles).
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  local_40.hid = (int)((ulong)((long)(this->handles).
                                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)(this->handles).
                                    super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
                 0x286bca1b +
                 (int)((ulong)((long)(this->handles).
                                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)(this->handles).
                                    super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
                 0x286bca1b +
                 ((int)((ulong)((long)ppBVar1 -
                               (long)(this->handles).
                                     super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
                 (uint)(ppBVar1 == (_Map_pointer)0x0)) * 3;
  local_41 = what;
  local_3c.gid = fed_id.gid;
  if (key._M_len == 0) {
    generateName_abi_cxx11_(&local_38,this,what);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,key._M_str,key._M_str + key._M_len);
  }
  std::deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>>::
  emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle_const&,helics::InterfaceType&,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
            ((deque<helics::BasicHandleInfo,std::allocator<helics::BasicHandleInfo>> *)this,
             &local_3c,&local_40,&local_41,&local_38,&type,&units);
  pBVar2 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar2 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar2 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  addSearchFields(this,pBVar2 + -1,local_40.hid);
  pBVar2 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar2 == (this->handles).
                super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pBVar2 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pBVar2 + -1;
}

Assistant:

BasicHandleInfo& HandleManager::addHandle(GlobalFederateId fed_id,
                                          InterfaceType what,
                                          std::string_view key,
                                          std::string_view type,
                                          std::string_view units)
{
    const InterfaceHandle local_id(static_cast<InterfaceHandle::BaseType>(handles.size()));
    const std::string actKey = (!key.empty()) ? std::string(key) : generateName(what);
    handles.emplace_back(fed_id, local_id, what, actKey, type, units);
    addSearchFields(handles.back(), local_id.baseValue());
    return handles.back();
}